

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseVersionNum(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserCtxtPtr pxVar2;
  xmlChar *tmp;
  int local_28;
  int iStack_24;
  xmlChar cur;
  int size;
  int len;
  xmlChar *buf;
  xmlParserCtxtPtr ctxt_local;
  
  local_28 = 10;
  _size = (xmlParserCtxtPtr)(*xmlMallocAtomic)(10);
  if (_size == (xmlParserCtxtPtr)0x0) {
    xmlErrMemory(ctxt,(char *)0x0);
    ctxt_local = (xmlParserCtxtPtr)0x0;
  }
  else {
    bVar1 = *ctxt->input->cur;
    if ((bVar1 < 0x30) || (0x39 < bVar1)) {
      (*xmlFree)(_size);
      ctxt_local = (xmlParserCtxtPtr)0x0;
    }
    else {
      *(byte *)&_size->sax = bVar1;
      xmlNextChar(ctxt);
      if (*ctxt->input->cur == '.') {
        *(undefined1 *)((long)&_size->sax + 1) = 0x2e;
        xmlNextChar(ctxt);
        tmp._7_1_ = *ctxt->input->cur;
        iStack_24 = 2;
        while (0x2f < tmp._7_1_ && tmp._7_1_ < 0x3a) {
          pxVar2 = _size;
          if (local_28 <= iStack_24 + 1) {
            local_28 = local_28 << 1;
            pxVar2 = (xmlParserCtxtPtr)(*xmlRealloc)(_size,(long)local_28);
            if (pxVar2 == (xmlParserCtxtPtr)0x0) {
              (*xmlFree)(_size);
              xmlErrMemory(ctxt,(char *)0x0);
              return (xmlChar *)0x0;
            }
          }
          _size = pxVar2;
          *(byte *)((long)&_size->sax + (long)iStack_24) = tmp._7_1_;
          xmlNextChar(ctxt);
          iStack_24 = iStack_24 + 1;
          tmp._7_1_ = *ctxt->input->cur;
        }
        *(undefined1 *)((long)&_size->sax + (long)iStack_24) = 0;
        ctxt_local = _size;
      }
      else {
        (*xmlFree)(_size);
        ctxt_local = (xmlParserCtxtPtr)0x0;
      }
    }
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

xmlChar *
xmlParseVersionNum(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = 10;
    xmlChar cur;

    buf = (xmlChar *) xmlMallocAtomic(size);
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	return(NULL);
    }
    cur = CUR;
    if (!((cur >= '0') && (cur <= '9'))) {
	xmlFree(buf);
	return(NULL);
    }
    buf[len++] = cur;
    NEXT;
    cur=CUR;
    if (cur != '.') {
	xmlFree(buf);
	return(NULL);
    }
    buf[len++] = cur;
    NEXT;
    cur=CUR;
    while ((cur >= '0') && (cur <= '9')) {
	if (len + 1 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size);
	    if (tmp == NULL) {
	        xmlFree(buf);
		xmlErrMemory(ctxt, NULL);
		return(NULL);
	    }
	    buf = tmp;
	}
	buf[len++] = cur;
	NEXT;
	cur=CUR;
    }
    buf[len] = 0;
    return(buf);
}